

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall
RegisterStringPieceUtilTestEqualsCaseInsensitiveASCII::
RegisterStringPieceUtilTestEqualsCaseInsensitiveASCII
          (RegisterStringPieceUtilTestEqualsCaseInsensitiveASCII *this)

{
  RegisterTest(StringPieceUtilTestEqualsCaseInsensitiveASCII::Create,
               "StringPieceUtilTest.EqualsCaseInsensitiveASCII");
  return;
}

Assistant:

TEST(StringPieceUtilTest, EqualsCaseInsensitiveASCII) {
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "abc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "ABC"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("AbC", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("", ""));

  EXPECT_FALSE(EqualsCaseInsensitiveASCII("a", "ac"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("/", "\\"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("1", "10"));
}